

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

BOOL __thiscall
Js::TypedArray<unsigned_short,_false,_true>::DirectSetItemNoSet
          (TypedArray<unsigned_short,_false,_true> *this,uint32 index,Var value)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  scriptContext =
       (((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
           super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00d882e5;
    *puVar3 = 0;
  }
  if (((ulong)value & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)value & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00d882e5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  else {
    JavascriptConversion::ToUInt16_Full(value,scriptContext);
  }
  if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached != true) {
    return 0;
  }
  JavascriptError::ThrowTypeError
            ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                 super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

inline BOOL Uint16VirtualArray::DirectSetItemNoSet(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItemNoSet(index, value, JavascriptConversion::ToUInt16);
    }